

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

ly_ctx_err_rec * ly_err_new_rec(ly_ctx *ctx)

{
  ly_ht *ht;
  uint32_t hash;
  LY_ERR LVar1;
  ly_ctx_err_rec *local_40;
  ly_ctx_err_rec *plStack_28;
  LY_ERR r;
  ly_ctx_err_rec *rec;
  ly_ctx_err_rec new;
  ly_ctx *ctx_local;
  
  rec = (ly_ctx_err_rec *)0x0;
  new.tid = (pthread_t)ctx;
  new.err = (ly_err_item *)pthread_self();
  pthread_mutex_lock((pthread_mutex_t *)(new.tid + 0x120));
  ht = *(ly_ht **)(new.tid + 0x118);
  hash = lyht_hash((char *)&new,8);
  LVar1 = lyht_insert(ht,&rec,hash,&stack0xffffffffffffffd8);
  pthread_mutex_unlock((pthread_mutex_t *)(new.tid + 0x120));
  if (LVar1 == LY_SUCCESS) {
    local_40 = plStack_28;
  }
  else {
    local_40 = (ly_ctx_err_rec *)0x0;
  }
  return local_40;
}

Assistant:

static struct ly_ctx_err_rec *
ly_err_new_rec(const struct ly_ctx *ctx)
{
    struct ly_ctx_err_rec new, *rec;
    LY_ERR r;

    /* insert a new record */
    new.err = NULL;
    new.tid = pthread_self();

    /* reuse lock */
    /* LOCK */
    pthread_mutex_lock((pthread_mutex_t *)&ctx->lyb_hash_lock);

    r = lyht_insert(ctx->err_ht, &new, lyht_hash((void *)&new.tid, sizeof new.tid), (void **)&rec);

    /* UNLOCK */
    pthread_mutex_unlock((pthread_mutex_t *)&ctx->lyb_hash_lock);

    return r ? NULL : rec;
}